

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QString * __thiscall
QAccessibleMenu::text(QString *__return_storage_ptr__,QAccessibleMenu *this,Text t)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  longlong __old_val;
  QWidget *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAccessibleWidget::text((QString *)&local_48,&this->super_QAccessibleWidget,t);
  qVar3 = local_48.size;
  pcVar2 = local_48.ptr;
  pDVar1 = local_48.d;
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
    if (t == Name) {
      this_00 = &menu(this)->super_QWidget;
      QWidget::windowTitle(__return_storage_ptr__,this_00);
    }
    else {
      local_48.d = (Data *)0x0;
      local_48.ptr = (char16_t *)0x0;
      local_48.size = 0;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = pcVar2;
      (__return_storage_ptr__->d).size = 0;
    }
  }
  else {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_48.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMenu::text(QAccessible::Text t) const
{
    QString tx = QAccessibleWidget::text(t);
    if (!tx.isEmpty())
        return tx;

    if (t == QAccessible::Name)
        return menu()->windowTitle();
    return tx;
}